

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O1

double get_max_scale(AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col)

{
  double dVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  undefined7 in_register_00000031;
  int row;
  int iVar5;
  double dVar6;
  double dVar7;
  
  uVar3 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [cpi->weber_bsize];
  iVar5 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar3]
          + mi_row;
  dVar6 = 10.0;
  iVar4 = mi_col;
  do {
    dVar7 = dVar6;
    if ((((mi_row < (cpi->common).mi_params.mi_rows) && (iVar4 < (cpi->common).mi_params.mi_cols))
        && (dVar1 = cpi->mb_weber_stats
                    [iVar4 / (int)(uint)bVar2 +
                     (mi_row / (int)(uint)bVar2) * (cpi->frame_info).mi_cols].max_scale,
           1.0 <= dVar1)) && (dVar7 = dVar1, dVar6 <= dVar1)) {
      dVar7 = dVar6;
    }
    iVar4 = iVar4 + (uint)bVar2;
    dVar6 = dVar7;
  } while ((iVar4 < (int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                [uVar3] + mi_col)) ||
          (mi_row = mi_row + (uint)bVar2, iVar4 = mi_col, mi_row < iVar5));
  return dVar7;
}

Assistant:

static double get_max_scale(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                            int mi_row, int mi_col) {
  const AV1_COMMON *const cm = &cpi->common;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];
  const int mi_step = mi_size_wide[cpi->weber_bsize];
  int mb_stride = cpi->frame_info.mi_cols;
  double min_max_scale = 10.0;

  for (int row = mi_row; row < mi_row + mi_high; row += mi_step) {
    for (int col = mi_col; col < mi_col + mi_wide; col += mi_step) {
      if (row >= cm->mi_params.mi_rows || col >= cm->mi_params.mi_cols)
        continue;
      const WeberStats *weber_stats =
          &cpi->mb_weber_stats[(row / mi_step) * mb_stride + (col / mi_step)];
      if (weber_stats->max_scale < 1.0) continue;
      if (weber_stats->max_scale < min_max_scale)
        min_max_scale = weber_stats->max_scale;
    }
  }
  return min_max_scale;
}